

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O1

int max_item_height_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int iVar4;
  Am_Slot_Key key;
  Am_Object item;
  Am_Value_List components;
  Am_Object local_30;
  Am_Value_List local_28;
  
  Am_Value_List::Am_Value_List(&local_28);
  pAVar3 = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=(&local_28,pAVar3);
  Am_Value_List::Start(&local_28);
  iVar4 = 0;
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_28);
    if (bVar1) break;
    local_30.data = (Am_Object_Data *)0x0;
    pAVar3 = Am_Value_List::Get(&local_28);
    Am_Object::operator=(&local_30,pAVar3);
    pAVar3 = Am_Object::Get(&local_30,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (bVar1) {
      pAVar3 = Am_Object::Get(&local_30,0x1d1,1);
      key = 0x1d1;
      if (pAVar3->type != 2) {
        key = 0x67;
      }
      pAVar3 = Am_Object::Get(&local_30,key,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
    }
    Am_Object::~Am_Object(&local_30);
    Am_Value_List::Next(&local_28);
  }
  Am_Value_List::~Am_Value_List(&local_28);
  return iVar4;
}

Assistant:

Am_Define_Formula(int, max_item_height)
{
  // based on Am_map_width in opal.cc
  // finds width of widest visible item

  Am_Value_List components;
  components = self.Get(Am_GRAPHICAL_PARTS);
  int height = 0;
  for (components.Start(); !components.Last(); components.Next()) {
    Am_Object item;
    item = components.Get();
    if ((bool)item.Get(Am_VISIBLE)) {
      int item_height;
      if (item.Get_Slot_Type(Am_REAL_HEIGHT) == Am_INT)
        item_height = item.Get(Am_REAL_HEIGHT);
      else
        item_height = item.Get(Am_HEIGHT);
      if (item_height > height)
        height = item_height;
    }
  }
  return height;
}